

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

target_ulong exception_resume_pc_mips64el(CPUMIPSState_conflict5 *env)

{
  int iVar1;
  target_ulong isa_mode;
  target_ulong bad_pc;
  CPUMIPSState_conflict5 *env_local;
  
  isa_mode = (env->active_tc).PC | (long)(int)(uint)((env->hflags & 0x400) != 0);
  if ((env->hflags & 0x87f800) != 0) {
    iVar1 = 4;
    if ((env->hflags & 0x4000) != 0) {
      iVar1 = 2;
    }
    isa_mode = isa_mode - (long)iVar1;
  }
  return isa_mode;
}

Assistant:

target_ulong exception_resume_pc(CPUMIPSState *env)
{
    target_ulong bad_pc;
    target_ulong isa_mode;

    isa_mode = !!(env->hflags & MIPS_HFLAG_M16);
    bad_pc = env->active_tc.PC | isa_mode;
    if (env->hflags & MIPS_HFLAG_BMASK) {
        /*
         * If the exception was raised from a delay slot, come back to
         * the jump.
         */
        bad_pc -= (env->hflags & MIPS_HFLAG_B16 ? 2 : 4);
    }

    return bad_pc;
}